

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int validate_length_range
              (uint8_t kind,uint64_t unum,int64_t snum,int64_t fnum,uint8_t fnum_dig,lys_type *type,
              char *val_str,lyd_node *node)

{
  ly_ctx *ctx_00;
  len_ran_intv *plVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  char *local_98;
  char *local_88;
  int match;
  ly_ctx *ctx;
  lys_type *cur_type;
  len_ran_intv *tmp_intv;
  len_ran_intv *intv;
  lys_restr *restr;
  lys_type *type_local;
  int64_t iStack_28;
  uint8_t fnum_dig_local;
  int64_t fnum_local;
  int64_t snum_local;
  uint64_t unum_local;
  uint8_t kind_local;
  
  intv = (len_ran_intv *)0x0;
  tmp_intv = (len_ran_intv *)0x0;
  ctx_00 = type->parent->module->ctx;
  restr = (lys_restr *)type;
  type_local._7_1_ = fnum_dig;
  iStack_28 = fnum;
  fnum_local = snum;
  snum_local = unum;
  unum_local._3_1_ = kind;
  iVar3 = resolve_len_ran_interval(ctx_00,(char *)0x0,type,&tmp_intv);
  if (iVar3 == 0) {
    if (tmp_intv != (len_ran_intv *)0x0) {
      cur_type = (lys_type *)tmp_intv;
      ctx = (ly_ctx *)tmp_intv->type;
LAB_00134f93:
      bVar2 = false;
      do {
        bVar4 = false;
        if (cur_type != (lys_type *)0x0) {
          bVar4 = (ly_ctx *)cur_type->parent == ctx;
        }
        if (!bVar4) goto LAB_001350e4;
        if (!bVar2) {
          if ((((unum_local._3_1_ == '\0') && ((ulong)snum_local < cur_type->ext)) ||
              ((unum_local._3_1_ == '\x01' && (fnum_local < (long)cur_type->ext)))) ||
             ((unum_local._3_1_ == '\x02' &&
              (iVar3 = dec64cmp(iStack_28,type_local._7_1_,(int64_t)cur_type->ext,
                                (ctx->dict).lock.__size[0x20]), iVar3 < 0)))) goto LAB_001350e4;
          if (((((unum_local._3_1_ == '\0') && (cur_type->ext <= (ulong)snum_local)) &&
               ((ulong)snum_local <= cur_type->der)) ||
              (((unum_local._3_1_ == '\x01' && ((long)cur_type->ext <= fnum_local)) &&
               (fnum_local <= (long)cur_type->der)))) ||
             (((unum_local._3_1_ == '\x02' &&
               (iVar3 = dec64cmp(iStack_28,type_local._7_1_,(int64_t)cur_type->ext,
                                 (ctx->dict).lock.__size[0x20]), -1 < iVar3)) &&
              (iVar3 = dec64cmp(iStack_28,type_local._7_1_,(int64_t)cur_type->der,
                                (ctx->dict).lock.__size[0x20]), iVar3 < 1)))) {
            bVar2 = true;
          }
        }
        cur_type = (cur_type->info).uni.types;
      } while( true );
    }
    unum_local._4_4_ = 0;
  }
  else {
    ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
           ,0x206);
    unum_local._4_4_ = 1;
  }
  return unum_local._4_4_;
LAB_001350e4:
  if ((!bVar2) || (cur_type == (lys_type *)0x0)) {
    while (tmp_intv != (len_ran_intv *)0x0) {
      plVar1 = tmp_intv->next;
      free(tmp_intv);
      tmp_intv = plVar1;
    }
    if (!bVar2) {
      switch(*(undefined4 *)&(ctx->dict).hash_tab) {
      case 1:
        intv = (len_ran_intv *)(ctx->dict).lock.__data.__list.__prev;
        break;
      default:
        ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
               ,0x249);
        return 1;
      case 4:
        intv = (len_ran_intv *)(ctx->dict).lock.__data.__list.__prev;
        break;
      case 10:
        intv = (len_ran_intv *)(ctx->dict).lock.__data.__list.__prev;
        break;
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
        intv = (len_ran_intv *)(ctx->dict).lock.__data.__list.__prev;
      }
      if (val_str == (char *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = val_str;
      }
      if (intv == (len_ran_intv *)0x0) {
        local_98 = "";
      }
      else {
        local_98 = *(char **)intv;
      }
      ly_vlog(ctx_00,LYE_NOCONSTR,LY_VLOG_LYD,node,local_88,local_98);
      if ((intv != (len_ran_intv *)0x0) && (intv->next != (len_ran_intv *)0x0)) {
        ly_vlog_str(ctx_00,LY_VLOG_PREV,(char *)intv->next);
      }
      if ((intv != (len_ran_intv *)0x0) && (intv->type != (lys_type *)0x0)) {
        ly_err_last_set_apptag(ctx_00,(char *)intv->type);
      }
      return 1;
    }
    return 0;
  }
  ctx = (ly_ctx *)cur_type->parent;
  goto LAB_00134f93;
}

Assistant:

static int
validate_length_range(uint8_t kind, uint64_t unum, int64_t snum, int64_t fnum, uint8_t fnum_dig, struct lys_type *type,
                      const char *val_str, struct lyd_node *node)
{
    struct lys_restr *restr = NULL;
    struct len_ran_intv *intv = NULL, *tmp_intv;
    struct lys_type *cur_type;
    struct ly_ctx *ctx = type->parent->module->ctx;
    int match;

    if (resolve_len_ran_interval(ctx, NULL, type, &intv)) {
        /* already done during schema parsing */
        LOGINT(ctx);
        return EXIT_FAILURE;
    }
    if (!intv) {
        return EXIT_SUCCESS;
    }

    /* I know that all intervals belonging to a single restriction share one type pointer */
    tmp_intv = intv;
    cur_type = intv->type;
    do {
        match = 0;
        for (; tmp_intv && (tmp_intv->type == cur_type); tmp_intv = tmp_intv->next) {
            if (match) {
                /* just iterate through the rest of this restriction intervals */
                continue;
            }

            if (((kind == 0) && (unum < tmp_intv->value.uval.min))
                    || ((kind == 1) && (snum < tmp_intv->value.sval.min))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) < 0))) {
                break;
            }

            if (((kind == 0) && (unum >= tmp_intv->value.uval.min) && (unum <= tmp_intv->value.uval.max))
                    || ((kind == 1) && (snum >= tmp_intv->value.sval.min) && (snum <= tmp_intv->value.sval.max))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) > -1)
                    && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.max, cur_type->info.dec64.dig) < 1))) {
                match = 1;
            }
        }

        if (!match) {
            break;
        } else if (tmp_intv) {
            cur_type = tmp_intv->type;
        }
    } while (tmp_intv);

    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    if (!match) {
        switch (cur_type->base) {
        case LY_TYPE_BINARY:
            restr = cur_type->info.binary.length;
            break;
        case LY_TYPE_DEC64:
            restr = cur_type->info.dec64.range;
            break;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            restr = cur_type->info.num.range;
            break;
        case LY_TYPE_STRING:
            restr = cur_type->info.str.length;
            break;
        default:
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, (val_str ? val_str : ""), restr ? restr->expr : "");
        if (restr && restr->emsg) {
            ly_vlog_str(ctx, LY_VLOG_PREV, restr->emsg);
        }
        if (restr && restr->eapptag) {
            ly_err_last_set_apptag(ctx, restr->eapptag);
        }
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}